

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_c_nl.c
# Opt level: O0

void FeedObjGradient(void *p_user_data,int i,void *p_api_data)

{
  undefined8 in_RDX;
  undefined4 in_ESI;
  double in_RDI;
  int j;
  CAPIExample *pex;
  undefined4 local_24;
  undefined4 in_stack_fffffffffffffff0;
  
  for (local_24 = 0; local_24 < *(int *)((long)in_RDI + 0x68); local_24 = local_24 + 1) {
    NLW2_WriteSparseDblEntry
              ((void *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(int)((ulong)in_RDX >> 0x20),
               in_RDI);
  }
  return;
}

Assistant:

void FeedObjGradient(
    void* p_user_data, int i, void* p_api_data) {
  CAPIExample* pex = (CAPIExample*)p_user_data;
  assert(0==i);
  for (int j=0; j<pex->n_obj_nz; ++j)
    NLW2_WriteSparseDblEntry(p_api_data,
                             pex->obj_linpart[j].index_,
                             pex->obj_linpart[j].value_);
}